

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  if ((this->opt->duration != false) || (bVar1 = 0, 1 < (uint)st->failure_flags)) {
    logTestStart(this);
    bVar1 = this->opt->duration;
  }
  if ((bVar1 & 1) != 0) {
    poVar3 = this->s;
    Color::operator<<(poVar3,None);
    lVar5 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 8) = 6;
    lVar5 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar3 + lVar5 + 0x18) = *(uint *)(poVar3 + lVar5 + 0x18) & 0xfffffefb | 4;
    poVar3 = std::ostream::_M_insert<double>(st->seconds);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," s: ",4);
    pcVar6 = this->tc->m_name;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar4 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  uVar2 = st->failure_flags;
  if ((uVar2 & 0x10) != 0) {
    poVar3 = this->s;
    Color::operator<<(poVar3,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Test case exceeded time limit of ",0x21);
    lVar5 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 8) = 6;
    lVar5 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar3 + lVar5 + 0x18) = *(uint *)(poVar3 + lVar5 + 0x18) & 0xfffffefb | 4;
    poVar3 = std::ostream::_M_insert<double>(this->tc->m_timeout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!\n",2);
    uVar2 = st->failure_flags;
  }
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 & 0x40) == 0) {
      if ((uVar2 >> 9 & 1) == 0) {
        if ((char)uVar2 < '\0') {
          poVar3 = this->s;
          Color::operator<<(poVar3,Red);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Didn\'t fail exactly ",0x14);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->tc->m_expected_failures);
          pcVar6 = " times so marking it as failed!\n";
          lVar5 = 0x20;
        }
        else {
          if ((uVar2 >> 8 & 1) == 0) goto LAB_00148afe;
          poVar3 = this->s;
          Color::operator<<(poVar3,Yellow);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Failed exactly ",0xf);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->tc->m_expected_failures);
          pcVar6 = " times as expected so marking it as not failed!\n";
          lVar5 = 0x30;
        }
      }
      else {
        poVar3 = this->s;
        Color::operator<<(poVar3,Yellow);
        pcVar6 = "Allowed to fail so marking it as not failed\n";
        lVar5 = 0x2c;
      }
    }
    else {
      poVar3 = this->s;
      Color::operator<<(poVar3,Yellow);
      pcVar6 = "Failed as expected so marking it as not failed\n";
      lVar5 = 0x2f;
    }
  }
  else {
    poVar3 = this->s;
    Color::operator<<(poVar3,Red);
    pcVar6 = "Should have failed but didn\'t! Marking it as failed!\n";
    lVar5 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
LAB_00148afe:
  if ((st->failure_flags & 8) != 0) {
    poVar3 = this->s;
    Color::operator<<(poVar3,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Aborting - too many failed asserts!\n",0x24);
  }
  Color::operator<<(this->s,None);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != TestCaseFailureReason::AssertFailure))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }